

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O2

void printEdge(Edge *i_edge,int length)

{
  ulong uVar1;
  ulong uVar2;
  
  fprintf(_stdout,"Solution with %d edges ",(ulong)(uint)length);
  uVar1 = (ulong)(uint)length;
  if (length < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    fprintf(_stdout,"%d-%d ",(ulong)(uint)i_edge[uVar2].start,(ulong)(uint)i_edge[uVar2].end);
  }
  fputc(10,_stdout);
  return;
}

Assistant:

void printEdge(const Edge *i_edge, int length)
{
    fprintf(stdout, "Solution with %d edges ", length);
    for (int i = 0; i < length; i++)
    {
        fprintf(stdout, "%d-%d ", i_edge[i].start, i_edge[i].end);
    }
    fprintf(stdout, "\n");
}